

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::SyncPointVk::SyncPointVk
          (SyncPointVk *this,SoftwareQueueIndex CommandQueueId,Uint32 NumContexts,
          VulkanSyncObjectManager *SyncObjectMngr,VkDevice LogicalDevice,Uint64 dbgValue)

{
  VulkanRecycledFence *__return_storage_ptr__;
  VulkanRecycledSemaphore *pSemaphores;
  ulong uVar1;
  bool bVar2;
  char cVar3;
  byte bVar4;
  undefined8 *puVar5;
  long *plVar6;
  uint uVar7;
  ulong *puVar8;
  Uint64 UVar9;
  size_type *psVar10;
  long lVar11;
  ulong uVar12;
  char cVar13;
  ulong uVar14;
  String Name;
  string __str_2;
  string __str_1;
  string __str;
  ulong *local_1c0;
  long local_1b8;
  ulong local_1b0;
  undefined8 uStack_1a8;
  uint local_19c;
  ulong *local_198;
  long local_190;
  ulong local_188;
  long lStack_180;
  ulong *local_178;
  long local_170;
  ulong local_168;
  undefined8 uStack_160;
  ulong *local_158;
  long local_150;
  ulong local_148;
  undefined8 uStack_140;
  undefined1 local_138 [32];
  ulong *local_118;
  long local_110;
  ulong local_108;
  undefined8 uStack_100;
  long *local_f8;
  undefined8 local_f0;
  long local_e8;
  undefined8 uStack_e0;
  VulkanRecycledFence *local_d8;
  ulong *local_d0;
  uint local_c8;
  undefined4 uStack_c4;
  ulong local_c0 [2];
  ulong *local_b0;
  uint local_a8;
  undefined4 uStack_a4;
  ulong local_a0 [2];
  ulong *local_90;
  uint local_88;
  undefined4 uStack_84;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  SyncPointVk *local_50;
  VkDevice local_48;
  Uint64 local_40;
  long local_38;
  
  (this->super_enable_shared_from_this<Diligent::SyncPointVk>)._M_weak_this.
  super___weak_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<Diligent::SyncPointVk>)._M_weak_this.
  super___weak_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_CommandQueueId).m_Value = CommandQueueId.m_Value;
  this->m_NumSemaphores = (Uint8)NumContexts;
  __return_storage_ptr__ = &this->m_Fence;
  local_48 = LogicalDevice;
  VulkanUtilities::VulkanSyncObjectManager::CreateFence(__return_storage_ptr__,SyncObjectMngr);
  pSemaphores = this->m_Semaphores;
  *(undefined8 *)
   ((long)&this->m_Semaphores[0].m_pManager.
           super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 1) = 0;
  *(undefined8 *)((long)&this->m_Semaphores[0].m_VkSyncObject + 1) = 0;
  this->m_Semaphores[0].m_pManager.
  super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this->m_Semaphores[0].m_pManager.
  super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((this->m_CommandQueueId).m_Value != CommandQueueId.m_Value) {
    FormatString<char[45]>
              ((string *)local_138,(char (*) [45])"Not enough bits to store command queue index");
    DebugAssertionFailed
              ((Char *)local_138._0_8_,"SyncPointVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0x5a);
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
  }
  if (this->m_NumSemaphores != NumContexts) {
    FormatString<char[45]>
              ((string *)local_138,(char (*) [45])"Not enough bits to store command queue count");
    DebugAssertionFailed
              ((Char *)local_138._0_8_,"SyncPointVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0x5b);
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
  }
  local_19c = (uint)CommandQueueId.m_Value;
  if (1 < NumContexts) {
    lVar11 = 0;
    do {
      puVar5 = (undefined8 *)((long)this[1].m_Semaphores + lVar11 + -0x2f);
      *puVar5 = 0;
      puVar5[1] = 0;
      puVar5 = (undefined8 *)((long)this[1].m_Semaphores + lVar11 + -0x38);
      *puVar5 = 0;
      puVar5[1] = 0;
      lVar11 = lVar11 + 0x20;
    } while ((ulong)NumContexts * 0x20 + -0x20 != lVar11);
    if (1 < NumContexts) {
      VulkanUtilities::VulkanSyncObjectManager::CreateSemaphores
                (SyncObjectMngr,pSemaphores,NumContexts - 1);
      uVar14 = (ulong)(local_19c << 5);
      puVar5 = (undefined8 *)
               ((long)&(pSemaphores->m_pManager).
                       super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + uVar14);
      local_138._0_8_ = *puVar5;
      local_138._8_8_ = puVar5[1];
      *(undefined8 *)
       ((long)&this->m_Semaphores[0].m_pManager.
               super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi + uVar14) = 0;
      *(undefined8 *)
       ((long)&(pSemaphores->m_pManager).
               super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr + uVar14) = 0;
      local_138._16_8_ = *(size_type *)((long)&this->m_Semaphores[0].m_VkSyncObject + uVar14);
      local_138[0x18] = (&this->m_Semaphores[0].m_IsUnsignaled)[uVar14];
      *(undefined8 *)((long)&this->m_Semaphores[0].m_VkSyncObject + uVar14) = 0;
      VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>
      ::operator=((RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)
                  ((long)&(pSemaphores->m_pManager).
                          super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + uVar14),pSemaphores + (NumContexts - 1));
      VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>
      ::operator=(pSemaphores + (NumContexts - 1),
                  (RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)local_138);
      VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>
      ::~RecycledSyncObject((RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)local_138);
    }
  }
  local_158 = &local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"Queue (","");
  local_38 = 1;
  if (9 < CommandQueueId.m_Value) {
    local_38 = 3 - (ulong)(CommandQueueId.m_Value < 100);
  }
  local_198 = &local_188;
  std::__cxx11::string::_M_construct((ulong)&local_198,(char)local_38);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_198,(uint)local_190,local_19c);
  uVar14 = 0xf;
  if (local_158 != &local_148) {
    uVar14 = local_148;
  }
  if (uVar14 < (ulong)(local_190 + local_150)) {
    uVar14 = 0xf;
    if (local_198 != &local_188) {
      uVar14 = local_188;
    }
    if (uVar14 < (ulong)(local_190 + local_150)) goto LAB_002802ae;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_158);
  }
  else {
LAB_002802ae:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_198);
  }
  local_118 = &local_108;
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_108 = *puVar8;
    uStack_100 = puVar5[3];
  }
  else {
    local_108 = *puVar8;
    local_118 = (ulong *)*puVar5;
  }
  local_110 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
  local_1c0 = &local_1b0;
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_1b0 = *puVar8;
    uStack_1a8 = puVar5[3];
  }
  else {
    local_1b0 = *puVar8;
    local_1c0 = (ulong *)*puVar5;
  }
  local_1b8 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  cVar13 = '\x01';
  if (9 < dbgValue) {
    UVar9 = dbgValue;
    cVar3 = '\x04';
    do {
      cVar13 = cVar3;
      if (UVar9 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_002803ce;
      }
      if (UVar9 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_002803ce;
      }
      if (UVar9 < 10000) goto LAB_002803ce;
      bVar2 = 99999 < UVar9;
      UVar9 = UVar9 / 10000;
      cVar3 = cVar13 + '\x04';
    } while (bVar2);
    cVar13 = cVar13 + '\x01';
  }
LAB_002803ce:
  local_178 = &local_168;
  std::__cxx11::string::_M_construct((ulong)&local_178,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_178,(uint)local_170,dbgValue);
  uVar14 = 0xf;
  if (local_1c0 != &local_1b0) {
    uVar14 = local_1b0;
  }
  if (uVar14 < (ulong)(local_170 + local_1b8)) {
    uVar14 = 0xf;
    if (local_178 != &local_168) {
      uVar14 = local_168;
    }
    if ((ulong)(local_170 + local_1b8) <= uVar14) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_1c0);
      goto LAB_00280455;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_178);
LAB_00280455:
  local_f8 = &local_e8;
  plVar6 = puVar5 + 2;
  if ((long *)*puVar5 == plVar6) {
    local_e8 = *plVar6;
    uStack_e0 = puVar5[3];
  }
  else {
    local_e8 = *plVar6;
    local_f8 = (long *)*puVar5;
  }
  local_f0 = puVar5[1];
  *puVar5 = plVar6;
  puVar5[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
  local_138._0_8_ = local_138 + 0x10;
  psVar10 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar10) {
    local_138._16_8_ = *psVar10;
    local_138._24_8_ = plVar6[3];
  }
  else {
    local_138._16_8_ = *psVar10;
    local_138._0_8_ = (size_type *)*plVar6;
  }
  local_138._8_8_ = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168 + 1);
  }
  local_d8 = __return_storage_ptr__;
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,local_188 + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  local_50 = this;
  VulkanUtilities::SetFenceName(local_48,(this->m_Fence).m_VkSyncObject,(char *)local_138._0_8_);
  bVar4 = this->m_NumSemaphores;
  if (bVar4 != 0) {
    uVar14 = 0;
    local_40 = dbgValue;
    do {
      if (this->m_Semaphores[uVar14].m_VkSyncObject != (NativeType)0x0) {
        local_70 = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Queue (","");
        local_90 = local_80;
        std::__cxx11::string::_M_construct((ulong)&local_90,(char)local_38);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_90,local_88,local_19c);
        uVar12 = 0xf;
        if (local_70 != local_60) {
          uVar12 = local_60[0];
        }
        uVar1 = CONCAT44(uStack_84,local_88) + local_68;
        if (uVar12 < uVar1) {
          uVar12 = 0xf;
          if (local_90 != local_80) {
            uVar12 = local_80[0];
          }
          if (uVar12 < uVar1) goto LAB_002806e1;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
        }
        else {
LAB_002806e1:
          puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
        }
        local_178 = &local_168;
        puVar8 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar8) {
          local_168 = *puVar8;
          uStack_160 = puVar5[3];
        }
        else {
          local_168 = *puVar8;
          local_178 = (ulong *)*puVar5;
        }
        local_170 = puVar5[1];
        *puVar5 = puVar8;
        puVar5[1] = 0;
        *(undefined1 *)puVar8 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
        local_198 = &local_188;
        puVar8 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar8) {
          local_188 = *puVar8;
          lStack_180 = plVar6[3];
        }
        else {
          local_188 = *puVar8;
          local_198 = (ulong *)*plVar6;
        }
        local_190 = plVar6[1];
        *plVar6 = (long)puVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        cVar13 = '\x01';
        if (9 < dbgValue) {
          uVar12 = dbgValue;
          cVar3 = '\x04';
          do {
            cVar13 = cVar3;
            if (uVar12 < 100) {
              cVar13 = cVar13 + -2;
              goto LAB_002807f0;
            }
            if (uVar12 < 1000) {
              cVar13 = cVar13 + -1;
              goto LAB_002807f0;
            }
            if (uVar12 < 10000) goto LAB_002807f0;
            bVar2 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar3 = cVar13 + '\x04';
          } while (bVar2);
          cVar13 = cVar13 + '\x01';
        }
LAB_002807f0:
        local_b0 = local_a0;
        std::__cxx11::string::_M_construct((ulong)&local_b0,cVar13);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b0,local_a8,dbgValue);
        uVar12 = 0xf;
        if (local_198 != &local_188) {
          uVar12 = local_188;
        }
        uVar1 = CONCAT44(uStack_a4,local_a8) + local_190;
        if (uVar12 < uVar1) {
          uVar12 = 0xf;
          if (local_b0 != local_a0) {
            uVar12 = local_a0[0];
          }
          if (uVar12 < uVar1) goto LAB_0028087e;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_198);
        }
        else {
LAB_0028087e:
          puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_b0)
          ;
        }
        local_158 = &local_148;
        puVar8 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar8) {
          local_148 = *puVar8;
          uStack_140 = puVar5[3];
        }
        else {
          local_148 = *puVar8;
          local_158 = (ulong *)*puVar5;
        }
        local_150 = puVar5[1];
        *puVar5 = puVar8;
        puVar5[1] = 0;
        *(undefined1 *)puVar8 = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
        puVar8 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar8) {
          local_108 = *puVar8;
          uStack_100 = puVar5[3];
          local_118 = &local_108;
        }
        else {
          local_108 = *puVar8;
          local_118 = (ulong *)*puVar5;
        }
        local_110 = puVar5[1];
        *puVar5 = puVar8;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        cVar13 = '\x01';
        if (9 < uVar14) {
          uVar12 = uVar14;
          cVar3 = '\x04';
          do {
            cVar13 = cVar3;
            uVar7 = (uint)uVar12;
            if (uVar7 < 100) {
              cVar13 = cVar13 + -2;
              goto LAB_00280992;
            }
            if (uVar7 < 1000) {
              cVar13 = cVar13 + -1;
              goto LAB_00280992;
            }
            if (uVar7 < 10000) goto LAB_00280992;
            uVar12 = (uVar12 & 0xffffffff) / 10000;
            cVar3 = cVar13 + '\x04';
          } while (99999 < uVar7);
          cVar13 = cVar13 + '\x01';
        }
LAB_00280992:
        local_d0 = local_c0;
        std::__cxx11::string::_M_construct((ulong)&local_d0,cVar13);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_d0,local_c8,(uint)uVar14);
        uVar12 = 0xf;
        if (local_118 != &local_108) {
          uVar12 = local_108;
        }
        uVar1 = CONCAT44(uStack_c4,local_c8) + local_110;
        if (uVar12 < uVar1) {
          uVar12 = 0xf;
          if (local_d0 != local_c0) {
            uVar12 = local_c0[0];
          }
          if (uVar12 < uVar1) goto LAB_00280a24;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_118);
        }
        else {
LAB_00280a24:
          puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_d0)
          ;
        }
        local_1c0 = &local_1b0;
        puVar8 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar8) {
          local_1b0 = *puVar8;
          uStack_1a8 = puVar5[3];
        }
        else {
          local_1b0 = *puVar8;
          local_1c0 = (ulong *)*puVar5;
        }
        local_1b8 = puVar5[1];
        *puVar5 = puVar8;
        puVar5[1] = 0;
        *(undefined1 *)puVar8 = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c0);
        plVar6 = puVar5 + 2;
        if ((long *)*puVar5 == plVar6) {
          local_e8 = *plVar6;
          uStack_e0 = puVar5[3];
          local_f8 = &local_e8;
        }
        else {
          local_e8 = *plVar6;
          local_f8 = (long *)*puVar5;
        }
        local_f0 = puVar5[1];
        *puVar5 = plVar6;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_138,(string *)&local_f8);
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,local_e8 + 1);
        }
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0,local_1b0 + 1);
        }
        dbgValue = local_40;
        if (local_d0 != local_c0) {
          operator_delete(local_d0,local_c0[0] + 1);
        }
        if (local_118 != &local_108) {
          operator_delete(local_118,local_108 + 1);
        }
        if (local_158 != &local_148) {
          operator_delete(local_158,local_148 + 1);
        }
        if (local_b0 != local_a0) {
          operator_delete(local_b0,local_a0[0] + 1);
        }
        if (local_198 != &local_188) {
          operator_delete(local_198,local_188 + 1);
        }
        if (local_178 != &local_168) {
          operator_delete(local_178,local_168 + 1);
        }
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
        if (local_70 != local_60) {
          operator_delete(local_70,local_60[0] + 1);
        }
        VulkanUtilities::SetSemaphoreName
                  (local_48,pSemaphores[uVar14].m_VkSyncObject,(char *)local_138._0_8_);
        bVar4 = local_50->m_NumSemaphores;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < bVar4);
  }
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  return;
}

Assistant:

SyncPointVk::SyncPointVk(SoftwareQueueIndex                        CommandQueueId,
                         Uint32                                    NumContexts,
                         VulkanUtilities::VulkanSyncObjectManager& SyncObjectMngr,
                         VkDevice                                  LogicalDevice,
                         Uint64                                    dbgValue) :
    m_CommandQueueId{CommandQueueId},
    m_NumSemaphores{static_cast<Uint8>(NumContexts)},
    m_Fence{SyncObjectMngr.CreateFence()}
{
    VERIFY(m_CommandQueueId == CommandQueueId, "Not enough bits to store command queue index");
    VERIFY(m_NumSemaphores == NumContexts, "Not enough bits to store command queue count");

    // Call constructors for semaphores
    for (Uint32 s = _countof(m_Semaphores); s < NumContexts; ++s)
        new (&m_Semaphores[s]) VulkanUtilities::VulkanRecycledSemaphore{};

    // Semaphores are used to synchronize between queues; they are not used for synchronization within one queue.
    if (NumContexts > 1)
    {
        SyncObjectMngr.CreateSemaphores(m_Semaphores, NumContexts - 1);

        // Semaphore for the current queue is not used.
        std::swap(m_Semaphores[CommandQueueId], m_Semaphores[NumContexts - 1]);
    }

#ifdef DILIGENT_DEBUG
    String Name = String{"Queue ("} + std::to_string(CommandQueueId) + ") Value (" + std::to_string(dbgValue) + ")";
    VulkanUtilities::SetFenceName(LogicalDevice, m_Fence, Name.c_str());

    for (Uint32 s = 0; s < m_NumSemaphores; ++s)
    {
        if (m_Semaphores[s])
        {
            Name = String{"Queue ("} + std::to_string(CommandQueueId) + ") Value (" + std::to_string(dbgValue) + ") Ctx (" + std::to_string(s) + ")";
            VulkanUtilities::SetSemaphoreName(LogicalDevice, m_Semaphores[s], Name.c_str());
        }
    }
#endif
}